

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

event_item * decode_action(CManager_conflict cm,event_item *event,response_cache_element *act)

{
  void *pvVar1;
  FILE *pFVar2;
  int iVar3;
  __pid_t _Var4;
  ssize_t sVar5;
  event_item *peVar6;
  CMbuffer p_Var7;
  pthread_t pVar8;
  attr_list p_Var9;
  event_path_data evp;
  timespec ts;
  timespec local_48;
  response_cache_element *local_38;
  
  if (event->event_encoded == 0) {
    if (event->reference_format == (act->o).decode.target_reference_format) {
      return event;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                  ,0x4e1,
                  "event_item *decode_action(CManager, event_item *, response_cache_element *)");
  }
  if (event->contents < Event_CM_Owned) {
    sVar5 = FFS_est_decode_length((act->o).decode.context,event->encoded_event,event->event_len);
    peVar6 = (event_item *)INT_CMmalloc(0x68);
    peVar6->ref_count = 0;
    peVar6->event_encoded = 0;
    *(undefined8 *)&peVar6->contents = 0;
    peVar6->encoded_event = (void *)0x0;
    peVar6->event_len = 0;
    peVar6->reference_format = (FMFormat)0x0;
    peVar6->ioBuffer = (FFSBuffer)0x0;
    peVar6->decoded_event = (void *)0x0;
    peVar6->encoded_eventv = (FFSEncodeVector)0x0;
    peVar6->format = (CMFormat)0x0;
    peVar6->attrs = (attr_list)0x0;
    peVar6->cm = (CManager_conflict)0x0;
    peVar6->free_arg = (void *)0x0;
    peVar6->free_func = (EVFreeFunction)0x0;
    peVar6->ref_count = 1;
    peVar6->event_len = -1;
    peVar6->ioBuffer = (FFSBuffer)0x0;
    p_Var7 = cm_get_data_buf(cm,sVar5);
    pvVar1 = p_Var7->buffer;
    iVar3 = CMtrace_val[9];
    if (event->cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(event->cm,CMBufferVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)event->cm->CMTrace_file;
        local_38 = act;
        _Var4 = getpid();
        pVar8 = pthread_self();
        act = local_38;
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf((FILE *)event->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf((FILE *)event->cm->CMTrace_file,
              "Last cm_get_data_buf was for EVPath decode buffer2, return was %p\n",p_Var7);
    }
    fflush((FILE *)event->cm->CMTrace_file);
    if (event->event_len == -1) {
      puts("BAD LENGTH");
    }
    FFSdecode_to_buffer((act->o).decode.context,event->encoded_event,pvVar1);
    peVar6->decoded_event = pvVar1;
    peVar6->event_encoded = 0;
    peVar6->encoded_eventv = (FFSEncodeVector)0x0;
    peVar6->encoded_event = (void *)0x0;
    peVar6->event_len = 0;
    peVar6->cm = cm;
    peVar6->reference_format = (act->o).decode.target_reference_format;
    peVar6->contents = Event_CM_Owned;
    evp = (event_path_data)event->attrs;
    if (evp == (event_path_data)0x0) {
      p_Var9 = (attr_list)0x0;
    }
    else {
      p_Var9 = (attr_list)attr_copy_list();
    }
    peVar6->attrs = p_Var9;
    return_event(evp,event);
    return peVar6;
  }
  if (event->contents == Event_CM_Owned) {
    iVar3 = FFSdecode_in_place_possible((act->o).decode.decode_format);
    if (iVar3 == 0) {
      sVar5 = FFS_est_decode_length((act->o).decode.context,event->encoded_event,event->event_len);
      p_Var7 = cm_get_data_buf(cm,sVar5);
      pvVar1 = p_Var7->buffer;
      iVar3 = CMtrace_val[9];
      if (event->cm->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(event->cm,CMBufferVerbose);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar2 = (FILE *)event->cm->CMTrace_file;
          _Var4 = getpid();
          pVar8 = pthread_self();
          fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar8);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf((FILE *)event->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        fprintf((FILE *)event->cm->CMTrace_file,
                "Last cm_get_data_buf was for EVPath decode buffer, return was %p\n",p_Var7);
      }
      fflush((FILE *)event->cm->CMTrace_file);
      if (event->event_len == -1) {
        puts("BAD LENGTH");
      }
      FFSdecode_to_buffer((act->o).decode.context,event->encoded_event,pvVar1);
      event->decoded_event = pvVar1;
      event->event_encoded = 0;
      iVar3 = CMtrace_val[9];
      if (event->cm->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(event->cm,CMBufferVerbose);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar2 = (FILE *)event->cm->CMTrace_file;
          _Var4 = getpid();
          pVar8 = pthread_self();
          fprintf(pFVar2,"P%lxT%lx - ",(long)_Var4,pVar8);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_48);
          fprintf((FILE *)event->cm->CMTrace_file,"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
        }
        fprintf((FILE *)event->cm->CMTrace_file,"EVPath now returning original, data is %p\n",
                event->encoded_event);
      }
      fflush((FILE *)event->cm->CMTrace_file);
      INT_CMreturn_buffer(cm,event->encoded_event);
      event->encoded_event = (void *)0x0;
    }
    else {
      iVar3 = FFSdecode_in_place((act->o).decode.context,event->encoded_event,&local_48);
      if (iVar3 == 0) {
        puts("Decode failed");
        goto LAB_00130349;
      }
      event->decoded_event = (void *)local_48.tv_sec;
      event->encoded_event = (void *)0x0;
      event->event_encoded = 0;
    }
    event->reference_format = (act->o).decode.target_reference_format;
  }
  else {
LAB_00130349:
    event = (event_item *)0x0;
  }
  return event;
}

Assistant:

static event_item *
decode_action(CManager cm, event_item *event, response_cache_element *act)
{
    event_path_data evp = cm->evp;
    if (!event->event_encoded) {
	if (event->reference_format == act->o.decode.target_reference_format) {
	    return event;
	}
	assert(0);
    }
	
    switch(event->contents) {
    case Event_CM_Owned:
	if (FFSdecode_in_place_possible(act->o.decode.decode_format)) {
	    void *decode_buffer;
	    if (!FFSdecode_in_place(act->o.decode.context,
				    event->encoded_event, 
				    (void**) (intptr_t) &decode_buffer)) {
		printf("Decode failed\n");
		return 0;
	    }
	    event->decoded_event = decode_buffer;
	    event->encoded_event = NULL;
	    event->event_encoded = 0;
	    event->reference_format = act->o.decode.target_reference_format;
	    return event;
	} else {
	    size_t decoded_length = FFS_est_decode_length(act->o.decode.context, 
						       event->encoded_event,
						       event->event_len);
	    CMbuffer cm_decode_buf = cm_get_data_buf(cm, decoded_length);
	    void *decode_buffer = cm_decode_buf->buffer;
	    CMtrace_out(event->cm, CMBufferVerbose, "Last cm_get_data_buf was for EVPath decode buffer, return was %p\n", cm_decode_buf);
	    if (event->event_len == -1) printf("BAD LENGTH\n");
	    FFSdecode_to_buffer(act->o.decode.context, event->encoded_event, 
				decode_buffer);
	    event->decoded_event = decode_buffer;
	    event->event_encoded = 0;
	    CMtrace_out(event->cm, CMBufferVerbose, "EVPath now returning original, data is %p\n", event->encoded_event);
	    INT_CMreturn_buffer(cm, event->encoded_event);
	    event->encoded_event = NULL;
	    event->reference_format = act->o.decode.target_reference_format;
	    return event;
	}
    case Event_Freeable:
    case Event_App_Owned:
    {
	/* can't do anything with the old event, make a new one */
	size_t decoded_length = FFS_est_decode_length(act->o.decode.context, 
						   event->encoded_event,
						   event->event_len);
	event_item *new_event = get_free_event(evp);
	CMbuffer cm_decode_buf = cm_get_data_buf(cm, decoded_length);
	void *decode_buffer = cm_decode_buf->buffer;
	CMtrace_out(event->cm, CMBufferVerbose, "Last cm_get_data_buf was for EVPath decode buffer2, return was %p\n", cm_decode_buf);
	if (event->event_len == -1) printf("BAD LENGTH\n");
	FFSdecode_to_buffer(act->o.decode.context, 
			    event->encoded_event, decode_buffer);
	new_event->decoded_event = decode_buffer;
	new_event->event_encoded = 0;
	new_event->encoded_event = NULL;
	new_event->event_len = 0;
	new_event->encoded_eventv = NULL;
	new_event->cm = cm;
	new_event->reference_format = act->o.decode.target_reference_format;
	new_event->contents = Event_CM_Owned;
	if (event->attrs) {
	    new_event->attrs = attr_copy_list(event->attrs);
	} else {
	    new_event->attrs = NULL;
	}
	/* new event will take the place of old event */
	return_event(evp, event);
	return new_event;
    }
    }
    return NULL;   /* shouldn't ever happen */
}